

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O0

void compute_length_counts(u32 *A,uint root_idx,uint *len_counts,uint max_codeword_len)

{
  uint uVar1;
  uint depth;
  uint parent_depth;
  uint parent;
  int node;
  uint len;
  uint max_codeword_len_local;
  uint *len_counts_local;
  uint root_idx_local;
  u32 *A_local;
  
  for (len = 0; len <= max_codeword_len; len = len + 1) {
    len_counts[len] = 0;
  }
  len_counts[1] = 2;
  A[root_idx] = A[root_idx] & 0x3ff;
  for (node = root_idx - 1; -1 < node; node = node + -1) {
    uVar1 = (A[A[node] >> 10] >> 10) + 1;
    A[node] = A[node] & 0x3ff | uVar1 * 0x400;
    depth = max_codeword_len;
    if (max_codeword_len <= uVar1) {
      do {
        depth = depth - 1;
        uVar1 = depth;
      } while (len_counts[depth] == 0);
    }
    depth = uVar1;
    len_counts[depth] = len_counts[depth] - 1;
    len_counts[depth + 1] = len_counts[depth + 1] + 2;
  }
  return;
}

Assistant:

static void
compute_length_counts(u32 A[], unsigned root_idx, unsigned len_counts[],
		      unsigned max_codeword_len)
{
	unsigned len;
	int node;

	/*
	 * The key observations are:
	 *
	 * (1) We can traverse the non-leaf nodes of the tree, always visiting a
	 *     parent before its children, by simply iterating through the array
	 *     in reverse order.  Consequently, we can compute the depth of each
	 *     node in one pass, overwriting the parent indices with depths.
	 *
	 * (2) We can initially assume that in the real Huffman tree, both
	 *     children of the root are leaves.  This corresponds to two
	 *     codewords of length 1.  Then, whenever we visit a (non-leaf) node
	 *     during the traversal, we modify this assumption to account for
	 *     the current node *not* being a leaf, but rather its two children
	 *     being leaves.  This causes the loss of one codeword for the
	 *     current depth and the addition of two codewords for the current
	 *     depth plus one.
	 *
	 * (3) We can handle the length-limited constraint fairly easily by
	 *     simply using the largest length available when a depth exceeds
	 *     max_codeword_len.
	 */

	for (len = 0; len <= max_codeword_len; len++)
		len_counts[len] = 0;
	len_counts[1] = 2;

	/* Set the root node's depth to 0. */
	A[root_idx] &= SYMBOL_MASK;

	for (node = root_idx - 1; node >= 0; node--) {

		/* Calculate the depth of this node. */

		unsigned parent = A[node] >> NUM_SYMBOL_BITS;
		unsigned parent_depth = A[parent] >> NUM_SYMBOL_BITS;
		unsigned depth = parent_depth + 1;

		/*
		 * Set the depth of this node so that it is available when its
		 * children (if any) are processed.
		 */
		A[node] = (A[node] & SYMBOL_MASK) | (depth << NUM_SYMBOL_BITS);

		/*
		 * If needed, decrease the length to meet the length-limited
		 * constraint.  This is not the optimal method for generating
		 * length-limited Huffman codes!  But it should be good enough.
		 */
		if (depth >= max_codeword_len) {
			depth = max_codeword_len;
			do {
				depth--;
			} while (len_counts[depth] == 0);
		}

		/*
		 * Account for the fact that we have a non-leaf node at the
		 * current depth.
		 */
		len_counts[depth]--;
		len_counts[depth + 1] += 2;
	}
}